

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

OPJ_BOOL opj_j2k_decode_one_tile
                   (opj_j2k_t *p_j2k,opj_stream_private_t *p_stream,opj_event_mgr_t *p_manager)

{
  opj_tile_index_t *poVar1;
  opj_tcp_t *poVar2;
  OPJ_UINT32 OVar3;
  OPJ_BOOL OVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  OPJ_BOOL l_go_on;
  OPJ_UINT32 l_current_tile_no;
  ulong local_50;
  uint local_48;
  OPJ_UINT32 l_nb_comps;
  OPJ_INT32 l_tile_y1;
  OPJ_INT32 l_tile_x1;
  OPJ_INT32 l_tile_y0;
  OPJ_INT32 l_tile_x0;
  
  l_go_on = 1;
  if ((p_j2k->cstr_index->tile_index != (opj_tile_index_t *)0x0) ||
     (OVar4 = opj_j2k_allocate_tile_element_cstr_index(p_j2k), OVar4 != 0)) {
    local_50 = (ulong)(p_j2k->m_specific_param).m_encoder.m_encoded_tile_size;
    poVar1 = p_j2k->cstr_index->tile_index;
    if ((poVar1 != (opj_tile_index_t *)0x0) && (poVar1->tp_index != (opj_tp_index_t *)0x0)) {
      if (poVar1[local_50].nb_tps == 0) {
        lVar6 = (p_j2k->m_specific_param).m_decoder.m_last_sot_read_pos;
      }
      else {
        lVar6 = (poVar1[local_50].tp_index)->start_pos;
      }
      OVar4 = opj_stream_read_seek(p_stream,lVar6 + 2,p_manager);
      if (OVar4 == 0) {
LAB_0011972a:
        opj_event_msg(p_manager,1,"Problem with seek function\n");
        return 0;
      }
      if ((p_j2k->m_specific_param).m_decoder.m_state == 0x100) {
        (p_j2k->m_specific_param).m_decoder.m_state = 8;
      }
    }
    uVar5 = (p_j2k->m_cp).th * (p_j2k->m_cp).tw;
    if (uVar5 != 0) {
      poVar2 = (p_j2k->m_cp).tcps;
      lVar6 = 0;
      do {
        *(undefined4 *)((long)&poVar2->m_current_tile_part_number + lVar6) = 0xffffffff;
        lVar6 = lVar6 + 0x1640;
      } while ((ulong)uVar5 * 0x1640 - lVar6 != 0);
    }
    OVar4 = opj_j2k_read_tile_header
                      (p_j2k,&l_current_tile_no,(OPJ_UINT32 *)0x0,&l_tile_x0,&l_tile_y0,&l_tile_x1,
                       &l_tile_y1,&l_nb_comps,&l_go_on,p_stream,p_manager);
    if (OVar4 != 0) {
      local_48 = (int)local_50 + 1;
      do {
        OVar3 = l_current_tile_no;
        if (l_go_on == 0) {
LAB_00119711:
          OVar4 = opj_j2k_are_all_used_components_decoded(p_j2k,p_manager);
          return OVar4;
        }
        uVar7 = (ulong)l_current_tile_no;
        OVar4 = opj_j2k_decode_tile(p_j2k,l_current_tile_no,(OPJ_BYTE *)0x0,0,p_stream,p_manager);
        if (OVar4 == 0) {
          return 0;
        }
        uVar5 = OVar3 + 1;
        opj_event_msg(p_manager,4,"Tile %d/%d has been decoded.\n",(ulong)uVar5,
                      (ulong)((p_j2k->m_cp).tw * (p_j2k->m_cp).th));
        OVar4 = opj_j2k_update_image_data(p_j2k->m_tcd,p_j2k->m_output_image);
        if (OVar4 == 0) {
          return 0;
        }
        poVar2 = (p_j2k->m_cp).tcps;
        if (poVar2[uVar7].m_data != (OPJ_BYTE *)0x0) {
          opj_free(poVar2[uVar7].m_data);
          poVar2[uVar7].m_data = (OPJ_BYTE *)0x0;
          poVar2[uVar7].m_data_size = 0;
        }
        opj_event_msg(p_manager,4,"Image data has been updated with tile %d.\n\n",(ulong)uVar5);
        if (OVar3 == (OPJ_UINT32)local_50) {
          OVar4 = opj_stream_read_seek(p_stream,p_j2k->cstr_index->main_head_end + 2,p_manager);
          if (OVar4 != 0) goto LAB_00119711;
          goto LAB_0011972a;
        }
        opj_event_msg(p_manager,2,
                      "Tile read, decoded and updated is not the desired one (%d vs %d).\n",
                      (ulong)uVar5,(ulong)local_48);
        OVar4 = opj_j2k_read_tile_header
                          (p_j2k,&l_current_tile_no,(OPJ_UINT32 *)0x0,&l_tile_x0,&l_tile_y0,
                           &l_tile_x1,&l_tile_y1,&l_nb_comps,&l_go_on,p_stream,p_manager);
      } while (OVar4 != 0);
    }
  }
  return 0;
}

Assistant:

static OPJ_BOOL opj_j2k_decode_one_tile(opj_j2k_t *p_j2k,
                                        opj_stream_private_t *p_stream,
                                        opj_event_mgr_t * p_manager)
{
    OPJ_BOOL l_go_on = OPJ_TRUE;
    OPJ_UINT32 l_current_tile_no;
    OPJ_UINT32 l_tile_no_to_dec;
    OPJ_INT32 l_tile_x0, l_tile_y0, l_tile_x1, l_tile_y1;
    OPJ_UINT32 l_nb_comps;
    OPJ_UINT32 l_nb_tiles;
    OPJ_UINT32 i;

    /*Allocate and initialize some elements of codestrem index if not already done*/
    if (!p_j2k->cstr_index->tile_index) {
        if (!opj_j2k_allocate_tile_element_cstr_index(p_j2k)) {
            return OPJ_FALSE;
        }
    }
    /* Move into the codestream to the first SOT used to decode the desired tile */
    l_tile_no_to_dec = (OPJ_UINT32)
                       p_j2k->m_specific_param.m_decoder.m_tile_ind_to_dec;
    if (p_j2k->cstr_index->tile_index)
        if (p_j2k->cstr_index->tile_index->tp_index) {
            if (! p_j2k->cstr_index->tile_index[l_tile_no_to_dec].nb_tps) {
                /* the index for this tile has not been built,
                 *  so move to the last SOT read */
                if (!(opj_stream_read_seek(p_stream,
                                           p_j2k->m_specific_param.m_decoder.m_last_sot_read_pos + 2, p_manager))) {
                    opj_event_msg(p_manager, EVT_ERROR, "Problem with seek function\n");
                    return OPJ_FALSE;
                }
            } else {
                if (!(opj_stream_read_seek(p_stream,
                                           p_j2k->cstr_index->tile_index[l_tile_no_to_dec].tp_index[0].start_pos + 2,
                                           p_manager))) {
                    opj_event_msg(p_manager, EVT_ERROR, "Problem with seek function\n");
                    return OPJ_FALSE;
                }
            }
            /* Special case if we have previously read the EOC marker (if the previous tile getted is the last ) */
            if (p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_EOC) {
                p_j2k->m_specific_param.m_decoder.m_state = J2K_STATE_TPHSOT;
            }
        }

    /* Reset current tile part number for all tiles, and not only the one */
    /* of interest. */
    /* Not completely sure this is always correct but required for */
    /* ./build/bin/j2k_random_tile_access ./build/tests/tte1.j2k */
    l_nb_tiles = p_j2k->m_cp.tw * p_j2k->m_cp.th;
    for (i = 0; i < l_nb_tiles; ++i) {
        p_j2k->m_cp.tcps[i].m_current_tile_part_number = -1;
    }

    for (;;) {
        if (! opj_j2k_read_tile_header(p_j2k,
                                       &l_current_tile_no,
                                       NULL,
                                       &l_tile_x0, &l_tile_y0,
                                       &l_tile_x1, &l_tile_y1,
                                       &l_nb_comps,
                                       &l_go_on,
                                       p_stream,
                                       p_manager)) {
            return OPJ_FALSE;
        }

        if (! l_go_on) {
            break;
        }

        if (! opj_j2k_decode_tile(p_j2k, l_current_tile_no, NULL, 0,
                                  p_stream, p_manager)) {
            return OPJ_FALSE;
        }
        opj_event_msg(p_manager, EVT_INFO, "Tile %d/%d has been decoded.\n",
                      l_current_tile_no + 1, p_j2k->m_cp.th * p_j2k->m_cp.tw);

        if (! opj_j2k_update_image_data(p_j2k->m_tcd,
                                        p_j2k->m_output_image)) {
            return OPJ_FALSE;
        }
        opj_j2k_tcp_data_destroy(&p_j2k->m_cp.tcps[l_current_tile_no]);

        opj_event_msg(p_manager, EVT_INFO,
                      "Image data has been updated with tile %d.\n\n", l_current_tile_no + 1);

        if (l_current_tile_no == l_tile_no_to_dec) {
            /* move into the codestream to the first SOT (FIXME or not move?)*/
            if (!(opj_stream_read_seek(p_stream, p_j2k->cstr_index->main_head_end + 2,
                                       p_manager))) {
                opj_event_msg(p_manager, EVT_ERROR, "Problem with seek function\n");
                return OPJ_FALSE;
            }
            break;
        } else {
            opj_event_msg(p_manager, EVT_WARNING,
                          "Tile read, decoded and updated is not the desired one (%d vs %d).\n",
                          l_current_tile_no + 1, l_tile_no_to_dec + 1);
        }

    }

    if (! opj_j2k_are_all_used_components_decoded(p_j2k, p_manager)) {
        return OPJ_FALSE;
    }

    return OPJ_TRUE;
}